

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPo.c
# Opt level: O3

Vec_Wec_t * Gia_PolynGetResult(Hsh_VecMan_t *pHashC,Hsh_VecMan_t *pHashM,Vec_Int_t *vCoefs)

{
  void *__ptr;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  uint *__ptr_00;
  void *pvVar5;
  Vec_Wec_t *p;
  int *piVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  Vec_Int_t *pVVar14;
  long lVar15;
  int iVar16;
  
  iVar13 = vCoefs->nSize;
  if (iVar13 < 1) {
    __ptr_00 = (uint *)malloc(0x10);
    iVar11 = 0;
    uVar9 = 1;
    uVar12 = 0;
    uVar2 = 8;
  }
  else {
    lVar4 = 0;
    iVar11 = 0;
    uVar12 = 0;
    do {
      uVar2 = vCoefs->pArray[lVar4];
      if ((ulong)uVar2 != 0) {
        if (((int)uVar2 < 0) || (pHashC->vMap->nSize <= (int)uVar2)) goto LAB_00672961;
        iVar13 = pHashC->vMap->pArray[uVar2];
        if (((long)iVar13 < 0) || (pHashC->vData->nSize <= iVar13)) goto LAB_00672980;
        piVar6 = pHashC->vData->pArray + iVar13;
        iVar13 = *piVar6;
        (pHashC->vTemp).nCap = iVar13;
        (pHashC->vTemp).nSize = iVar13;
        (pHashC->vTemp).pArray = piVar6 + 2;
        if (iVar13 < 1) goto LAB_00672961;
        uVar2 = piVar6[2];
        uVar9 = -uVar2;
        if (0 < (int)uVar2) {
          uVar9 = uVar2;
        }
        if ((int)uVar12 <= (int)uVar9) {
          uVar12 = uVar9;
        }
        iVar11 = iVar11 + 1;
        iVar13 = vCoefs->nSize;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar13);
    iVar11 = iVar11 * 2;
    uVar9 = uVar12 + 1;
    __ptr_00 = (uint *)malloc(0x10);
    uVar2 = 8;
    if (6 < uVar12) {
      uVar2 = uVar9;
    }
  }
  *__ptr_00 = uVar2;
  pvVar5 = calloc((ulong)uVar2,0x10);
  *(void **)(__ptr_00 + 2) = pvVar5;
  __ptr_00[1] = uVar9;
  if (0 < iVar13) {
    lVar4 = 0;
    do {
      uVar2 = vCoefs->pArray[lVar4];
      if ((ulong)uVar2 != 0) {
        if (((int)uVar2 < 0) || (pHashC->vMap->nSize <= (int)uVar2)) {
LAB_00672961:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar13 = pHashC->vMap->pArray[uVar2];
        if (((long)iVar13 < 0) || (pHashC->vData->nSize <= iVar13)) {
LAB_00672980:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        piVar6 = pHashC->vData->pArray + iVar13;
        iVar13 = *piVar6;
        (pHashC->vTemp).nCap = iVar13;
        (pHashC->vTemp).nSize = iVar13;
        (pHashC->vTemp).pArray = piVar6 + 2;
        if (iVar13 < 1) goto LAB_00672961;
        uVar9 = piVar6[2];
        uVar3 = -uVar9;
        if (0 < (int)uVar9) {
          uVar3 = uVar9;
        }
        if ((int)uVar12 < (int)uVar3) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        if (pHashM->vMap->nSize <= lVar4) goto LAB_00672961;
        iVar13 = pHashM->vMap->pArray[lVar4];
        if (((long)iVar13 < 0) || (pHashM->vData->nSize <= iVar13)) goto LAB_00672980;
        piVar6 = pHashM->vData->pArray + iVar13;
        iVar13 = *piVar6;
        (pHashM->vTemp).nCap = iVar13;
        (pHashM->vTemp).nSize = iVar13;
        (pHashM->vTemp).pArray = piVar6 + 2;
        if (iVar13 == 0) {
          iVar13 = -1;
        }
        else {
          if (iVar13 < 1) goto LAB_00672961;
          iVar13 = piVar6[2];
        }
        pVVar14 = (Vec_Int_t *)((ulong)uVar3 * 0x10 + (long)pvVar5);
        Vec_IntPush(pVVar14,uVar2);
        Vec_IntPush(pVVar14,(int)lVar4);
        Vec_IntPush(pVVar14,iVar13);
        iVar13 = vCoefs->nSize;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar13);
  }
  p = (Vec_Wec_t *)malloc(0x10);
  iVar13 = 8;
  if (6 < iVar11 - 1U) {
    iVar13 = iVar11;
  }
  p->nSize = 0;
  p->nCap = iVar13;
  iVar16 = 0;
  if (iVar13 == 0) {
    pVVar14 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar14 = (Vec_Int_t *)calloc((long)iVar13,0x10);
  }
  p->pArray = pVVar14;
  uVar12 = __ptr_00[1];
  if (0 < (long)(int)uVar12) {
    lVar4 = *(long *)(__ptr_00 + 2);
    lVar7 = 0;
    do {
      lVar10 = lVar7 * 0x10;
      qsort(*(void **)(lVar4 + 8 + lVar10),(long)(*(int *)(lVar4 + 4 + lVar10) / 3),0xc,
            Gia_PolynGetResultCompare);
      if (2 < *(int *)(lVar4 + 4 + lVar10)) {
        lVar15 = 0;
        do {
          lVar8 = *(long *)(lVar10 + lVar4 + 8);
          iVar13 = *(int *)(lVar8 + lVar15 * 4);
          if (((long)iVar13 < 0) || (pHashC->vMap->nSize <= iVar13)) goto LAB_00672961;
          iVar13 = pHashC->vMap->pArray[iVar13];
          if (((long)iVar13 < 0) || (pHashC->vData->nSize <= iVar13)) goto LAB_00672980;
          uVar2 = *(uint *)(lVar8 + 4 + lVar15 * 4);
          piVar6 = pHashC->vData->pArray + iVar13;
          iVar13 = *piVar6;
          (pHashC->vTemp).nCap = iVar13;
          (pHashC->vTemp).nSize = iVar13;
          (pHashC->vTemp).pArray = piVar6 + 2;
          if (1 < (long)iVar13) {
            lVar8 = 1;
            do {
              uVar9 = piVar6[lVar8 + 1];
              uVar3 = (piVar6 + 2)[lVar8];
              uVar1 = -uVar9;
              if (0 < (int)uVar9) {
                uVar1 = uVar9;
              }
              uVar9 = -uVar3;
              if (0 < (int)uVar3) {
                uVar9 = uVar3;
              }
              if (uVar1 <= uVar9) {
                __assert_fail("Abc_AbsInt(p->pArray[i-1]) > Abc_AbsInt(p->pArray[i])",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecPo.c"
                              ,0xef,"void Vec_IntCheckUniqueOrderAbs(Vec_Int_t *)");
              }
              lVar8 = lVar8 + 1;
            } while (iVar13 != lVar8);
          }
          pVVar14 = Vec_WecPushLevel(p);
          iVar13 = (pHashC->vTemp).nSize;
          if (pVVar14->nCap < iVar13) {
            if (pVVar14->pArray == (int *)0x0) {
              piVar6 = (int *)malloc((long)iVar13 << 2);
            }
            else {
              piVar6 = (int *)realloc(pVVar14->pArray,(long)iVar13 << 2);
            }
            pVVar14->pArray = piVar6;
            if (piVar6 == (int *)0x0) goto LAB_0067299f;
            pVVar14->nCap = iVar13;
            iVar13 = (pHashC->vTemp).nSize;
          }
          if (0 < iVar13) {
            lVar8 = 0;
            do {
              Vec_IntPush(pVVar14,(pHashC->vTemp).pArray[lVar8]);
              lVar8 = lVar8 + 1;
            } while (lVar8 < (pHashC->vTemp).nSize);
          }
          if (((int)uVar2 < 0) || (pHashM->vMap->nSize <= (int)uVar2)) goto LAB_00672961;
          iVar13 = pHashM->vMap->pArray[uVar2];
          if (((long)iVar13 < 0) || (pHashM->vData->nSize <= iVar13)) goto LAB_00672980;
          piVar6 = pHashM->vData->pArray + iVar13;
          iVar13 = *piVar6;
          (pHashM->vTemp).nCap = iVar13;
          (pHashM->vTemp).nSize = iVar13;
          (pHashM->vTemp).pArray = piVar6 + 2;
          if (1 < (long)iVar13) {
            lVar8 = 1;
            do {
              if ((piVar6 + 2)[lVar8] <= piVar6[lVar8 + 1]) {
                __assert_fail("p->pArray[i-1] < p->pArray[i]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecPo.c"
                              ,0xf5,"void Vec_IntCheckUniqueOrder(Vec_Int_t *)");
              }
              lVar8 = lVar8 + 1;
            } while (iVar13 != lVar8);
          }
          pVVar14 = Vec_WecPushLevel(p);
          iVar13 = (pHashM->vTemp).nSize;
          if (pVVar14->nCap < iVar13) {
            if (pVVar14->pArray == (int *)0x0) {
              piVar6 = (int *)malloc((long)iVar13 << 2);
            }
            else {
              piVar6 = (int *)realloc(pVVar14->pArray,(long)iVar13 << 2);
            }
            pVVar14->pArray = piVar6;
            if (piVar6 == (int *)0x0) {
LAB_0067299f:
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            pVVar14->nCap = iVar13;
            iVar13 = (pHashM->vTemp).nSize;
          }
          if (0 < iVar13) {
            lVar8 = 0;
            do {
              Vec_IntPush(pVVar14,(pHashM->vTemp).pArray[lVar8]);
              lVar8 = lVar8 + 1;
            } while (lVar8 < (pHashM->vTemp).nSize);
          }
          iVar13 = (int)lVar15;
          lVar15 = lVar15 + 3;
        } while (iVar13 + 5 < *(int *)(lVar10 + lVar4 + 4));
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != (int)uVar12);
    iVar16 = p->nSize;
  }
  if (iVar16 != iVar11) {
    __assert_fail("Vec_WecSize(vPolyn) == 2*nNonConst",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecPo.c"
                  ,0x17c,
                  "Vec_Wec_t *Gia_PolynGetResult(Hsh_VecMan_t *, Hsh_VecMan_t *, Vec_Int_t *)");
  }
  uVar12 = *__ptr_00;
  pvVar5 = *(void **)(__ptr_00 + 2);
  if ((long)(int)uVar12 < 1) {
    if (pvVar5 == (void *)0x0) goto LAB_00672908;
  }
  else {
    lVar4 = 0;
    do {
      __ptr = *(void **)((long)pvVar5 + lVar4 + 8);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)pvVar5 + lVar4 + 8) = 0;
      }
      lVar4 = lVar4 + 0x10;
    } while ((long)(int)uVar12 * 0x10 != lVar4);
  }
  free(pvVar5);
LAB_00672908:
  free(__ptr_00);
  return p;
}

Assistant:

Vec_Wec_t * Gia_PolynGetResult( Hsh_VecMan_t * pHashC, Hsh_VecMan_t * pHashM, Vec_Int_t * vCoefs )
{
    Vec_Int_t * vClass, * vLevel, * vArray;
    Vec_Wec_t * vPolyn, * vSorted;
    int i, k, iConst, iMono, iFirst;
    // find the largest 
    int nLargest = 0, nNonConst = 0;
    Vec_IntForEachEntry( vCoefs, iConst, iMono )
    {
        //Vec_IntPrint( Hsh_VecReadEntry(pHashM, iMono) );
        if ( iConst == 0 ) 
            continue;
        vArray = Hsh_VecReadEntry( pHashC, iConst );
        nLargest = Abc_MaxInt( nLargest, Abc_AbsInt(Vec_IntEntry(vArray, 0)) );
        nNonConst++;
    }
    // sort by the size of the largest coefficient
    vSorted = Vec_WecStart( nLargest+1 );
    Vec_IntForEachEntry( vCoefs, iConst, iMono )
    {
        if ( iConst == 0 ) 
            continue;
        vArray = Hsh_VecReadEntry( pHashC, iConst );
        vLevel = Vec_WecEntry( vSorted, Abc_AbsInt(Vec_IntEntry(vArray, 0)) );
        vArray = Hsh_VecReadEntry( pHashM, iMono );
        iFirst = Vec_IntSize(vArray) ? Vec_IntEntry(vArray, 0) : -1;
        Vec_IntPushThree( vLevel, iConst, iMono, iFirst );
    }
    // reload in the given order
    vPolyn = Vec_WecAlloc( 2*nNonConst );
    Vec_WecForEachLevel( vSorted, vClass, i )
    {
        // sort monomials by the index of the first variable
        qsort( Vec_IntArray(vClass), (size_t)(Vec_IntSize(vClass)/3), 12, (int (*)(const void *, const void *))Gia_PolynGetResultCompare );
        Vec_IntForEachEntryTriple( vClass, iConst, iMono, iFirst, k )
        {
            vArray = Hsh_VecReadEntry( pHashC, iConst );
            Vec_IntCheckUniqueOrderAbs( vArray );
            vLevel = Vec_WecPushLevel( vPolyn );
            Vec_IntGrow( vLevel, Vec_IntSize(vArray) );
            Vec_IntAppend( vLevel, vArray );

            vArray = Hsh_VecReadEntry( pHashM, iMono );
            Vec_IntCheckUniqueOrder( vArray );
            vLevel = Vec_WecPushLevel( vPolyn );
            Vec_IntGrow( vLevel, Vec_IntSize(vArray) );
            Vec_IntAppend( vLevel, vArray );
        }
    }
    assert( Vec_WecSize(vPolyn) == 2*nNonConst );
    Vec_WecFree( vSorted );
    return vPolyn;
}